

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQFunctionProto::SQFunctionProto(SQFunctionProto *this,SQSharedState *ss)

{
  SQSharedState *in_RSI;
  SQCollectable_conflict *in_RDI;
  SQCollectable *in_stack_ffffffffffffffb0;
  SQInstruction *local_40;
  
  SQCollectable::SQCollectable(in_stack_ffffffffffffffb0);
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQFunctionProto_00159578;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 1));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&in_RDI[1].super_SQRefCounted._weakref);
  local_40 = (SQInstruction *)&in_RDI[4]._prev;
  do {
    SQInstruction::SQInstruction(local_40);
    local_40 = local_40 + 1;
  } while (local_40 != (SQInstruction *)&in_RDI[4]._sharedstate);
  in_RDI[1]._prev = (SQCollectable_conflict *)0x0;
  *(undefined1 *)&in_RDI[1]._sharedstate = 0;
  in_RDI->_next = (SQCollectable_conflict *)0x0;
  in_RDI->_prev = (SQCollectable_conflict *)0x0;
  in_RDI->_sharedstate = in_RSI;
  SQCollectable::AddToChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  return;
}

Assistant:

SQFunctionProto::SQFunctionProto(SQSharedState *ss)
{
    _stacksize=0;
    _bgenerator=false;
    INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);
}